

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O3

uint8_t * WebPDecodeYUVInto(uint8_t *data,size_t data_size,uint8_t *luma,size_t luma_size,
                           int luma_stride,uint8_t *u,size_t u_size,int u_stride,uint8_t *v,
                           size_t v_size,int v_stride)

{
  VP8StatusCode VVar1;
  uint8_t *puVar2;
  WebPDecBuffer output;
  WebPDecParams local_118;
  WebPDecBuffer local_a8;
  
  if (luma == (uint8_t *)0x0) {
    puVar2 = (uint8_t *)0x0;
  }
  else {
    WebPInitDecBufferInternal(&local_a8,0x209);
    local_118.tmp_y = (uint8_t *)0x0;
    local_118.tmp_u = (uint8_t *)0x0;
    local_118.tmp_v = (uint8_t *)0x0;
    local_118.last_y = 0;
    local_118._36_4_ = 0;
    local_118.options = (WebPDecoderOptions *)0x0;
    local_118.scaler_y = (WebPRescaler *)0x0;
    local_118.scaler_u = (WebPRescaler *)0x0;
    local_118.scaler_v = (WebPRescaler *)0x0;
    local_118.scaler_a = (WebPRescaler *)0x0;
    local_118.memory = (void *)0x0;
    local_118.emit = (OutputFunc)0x0;
    local_118.emit_alpha = (OutputAlphaFunc)0x0;
    local_118.emit_alpha_row = (OutputRowFunc)0x0;
    local_a8.colorspace = MODE_YUV;
    local_a8.u.YUVA.u_stride = u_stride;
    local_a8.u.YUVA.u_size = u_size;
    local_a8.u.YUVA.v = v;
    local_a8.u.YUVA.v_stride = v_stride;
    local_a8.u.YUVA.v_size = v_size;
    local_a8.is_external_memory = 1;
    local_118.output = &local_a8;
    local_a8.u.RGBA.rgba = luma;
    local_a8.u.YUVA.u = u;
    local_a8.u.YUVA.y_stride = luma_stride;
    local_a8.u.YUVA.y_size = luma_size;
    VVar1 = DecodeInto(data,data_size,&local_118);
    puVar2 = (uint8_t *)0x0;
    if (VVar1 == VP8_STATUS_OK) {
      puVar2 = luma;
    }
  }
  return puVar2;
}

Assistant:

uint8_t* WebPDecodeYUVInto(const uint8_t* data, size_t data_size,
                           uint8_t* luma, size_t luma_size, int luma_stride,
                           uint8_t* u, size_t u_size, int u_stride,
                           uint8_t* v, size_t v_size, int v_stride) {
  WebPDecParams params;
  WebPDecBuffer output;
  if (luma == NULL) return NULL;
  WebPInitDecBuffer(&output);
  WebPResetDecParams(&params);
  params.output = &output;
  output.colorspace      = MODE_YUV;
  output.u.YUVA.y        = luma;
  output.u.YUVA.y_stride = luma_stride;
  output.u.YUVA.y_size   = luma_size;
  output.u.YUVA.u        = u;
  output.u.YUVA.u_stride = u_stride;
  output.u.YUVA.u_size   = u_size;
  output.u.YUVA.v        = v;
  output.u.YUVA.v_stride = v_stride;
  output.u.YUVA.v_size   = v_size;
  output.is_external_memory = 1;
  if (DecodeInto(data, data_size, &params) != VP8_STATUS_OK) {
    return NULL;
  }
  return luma;
}